

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::AppendToTestWarningsOutputFile(string *str)

{
  bool bVar1;
  int iVar2;
  void *__ptr;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  GTestLog local_38 [5];
  GTestLog local_24;
  FILE *local_20;
  FILE *file;
  char *filename;
  string *str_local;
  
  filename = (char *)str;
  file = (FILE *)posix::GetEnv("TEST_WARNINGS_OUTPUT_FILE");
  if ((file != (FILE *)0x0) &&
     (local_20 = (FILE *)posix::FOpen((char *)file,"a"), local_20 != (FILE *)0x0)) {
    __ptr = (void *)std::__cxx11::string::data();
    sVar3 = std::__cxx11::string::size();
    sVar3 = fwrite(__ptr,1,sVar3,local_20);
    sVar4 = std::__cxx11::string::size();
    bVar1 = IsTrue(sVar3 == sVar4);
    if (!bVar1) {
      GTestLog::GTestLog(&local_24,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/build_O0/googletest-src/googletest/src/gtest.cc"
                         ,0x1707);
      poVar5 = GTestLog::GetStream(&local_24);
      std::operator<<(poVar5,
                      "Condition fwrite(str.data(), 1, str.size(), file) == str.size() failed. ");
      GTestLog::~GTestLog(&local_24);
    }
    iVar2 = posix::FClose((FILE *)local_20);
    bVar1 = IsTrue(iVar2 == 0);
    if (!bVar1) {
      GTestLog::GTestLog(local_38,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/build_O0/googletest-src/googletest/src/gtest.cc"
                         ,0x1708);
      poVar5 = GTestLog::GetStream(local_38);
      std::operator<<(poVar5,"Condition posix::FClose(file) == 0 failed. ");
      GTestLog::~GTestLog(local_38);
    }
  }
  return;
}

Assistant:

static void AppendToTestWarningsOutputFile(const std::string& str) {
  const char* const filename = posix::GetEnv(kTestWarningsOutputFile);
  if (filename == nullptr) {
    return;
  }
  auto* const file = posix::FOpen(filename, "a");
  if (file == nullptr) {
    return;
  }
  GTEST_CHECK_(fwrite(str.data(), 1, str.size(), file) == str.size());
  GTEST_CHECK_(posix::FClose(file) == 0);
}